

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<float>::TPZFMatrix
          (TPZFMatrix<float> *this,void **vtt,int64_t rows,int64_t cols,float *val)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  void **in_RDI;
  undefined4 *in_R8;
  int64_t i;
  int64_t size;
  int64_t in_stack_ffffffffffffff98;
  TPZMatrix<float> *in_stack_ffffffffffffffb0;
  long local_48;
  
  TPZMatrix<float>::TPZMatrix
            (in_stack_ffffffffffffffb0,in_RDI,(int64_t)in_RSI,in_stack_ffffffffffffff98);
  *in_RDI = (void *)*in_RSI;
  in_RDI[4] = (void *)0x0;
  in_RDI[5] = (void *)0x0;
  in_RDI[6] = (void *)0x0;
  TPZManVector<int,_5>::TPZManVector((TPZManVector<int,_5> *)(in_RDI + 7),(int64_t)in_RDI);
  TPZVec<float>::TPZVec((TPZVec<float> *)(in_RDI + 0xe));
  uVar2 = in_RDX * in_RCX;
  if (uVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[4] = pvVar4;
    for (local_48 = 0; local_48 < (long)uVar2; local_48 = local_48 + 1) {
      *(undefined4 *)((long)in_RDI[4] + local_48 * 4) = *in_R8;
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,const TVar & val )
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>( rows, cols ), 
 fElem(0), fGiven(0), fSize(0) {
    int64_t size = rows * cols;
    if(!size) return;
    fElem=new TVar[size];
#ifdef PZDEBUG
    if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    for(int64_t i=0;i<size;i++) fElem[i] = val;
}